

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

int __thiscall Catch::Session::run<char>(Session *this,int argc,char **argv)

{
  int iVar1;
  
  if (this->m_startupExceptions == false) {
    iVar1 = applyCommandLine(this,argc,argv);
    if (iVar1 == 0) {
      iVar1 = run(this);
      return iVar1;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int run(int argc, CharT const * const argv[]) {
            if (m_startupExceptions)
                return 1;
            int returnCode = applyCommandLine(argc, argv);
            if (returnCode == 0)
                returnCode = run();
            return returnCode;
        }